

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack15_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7fff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0xf & 0x7fff;
  out[2] = uVar1 >> 0x1e;
  out[2] = uVar1 >> 0x1e | (uVar2 & 0x1fff) << 2;
  out[3] = uVar2 >> 0xd & 0x7fff;
  out[4] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[4] = uVar2 >> 0x1c | (uVar1 & 0x7ff) << 4;
  out[5] = uVar1 >> 0xb & 0x7fff;
  out[6] = uVar1 >> 0x1a;
  uVar2 = in[3];
  out[6] = uVar1 >> 0x1a | (uVar2 & 0x1ff) << 6;
  out[7] = uVar2 >> 9 & 0x7fff;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack15_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 15);
  out++;
  *out = ((*in) >> 15) % (1U << 15);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 13)) << (15 - 13);
  out++;
  *out = ((*in) >> 13) % (1U << 15);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 11)) << (15 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 15);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 9)) << (15 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 15);
  out++;

  return in + 1;
}